

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_SHA3.c
# Opt level: O3

void digest_(Spec_Hash_Definitions_hash_alg a,Hacl_Hash_SHA3_state_t *state,uint8_t *output,
            uint32_t l)

{
  uint64_t *__src;
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ushort uVar5;
  uint32_t i;
  uint32_t uVar6;
  uint32_t uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 *__dest;
  uint8_t *puVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  undefined1 auVar23 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  uint64_t buf [25];
  ulong local_588;
  uint uStack_580;
  uint uStack_57c;
  undefined8 uStack_578;
  undefined1 local_570 [16];
  ulong local_560;
  ulong uStack_558;
  ulong local_550;
  ulong uStack_548;
  ulong local_540;
  ulong local_538;
  ulong local_530;
  ulong local_528;
  ulong local_520;
  ulong local_518;
  ulong local_510;
  ulong local_508;
  ulong local_500;
  ulong local_4f8;
  ulong local_4f0;
  ulong local_4e8;
  ulong local_4e0;
  ulong local_4d8;
  ulong local_4d0;
  ulong local_4c8;
  uint8_t *local_4c0;
  ulong local_4b8;
  ulong local_4b0;
  ulong local_4a8;
  uint local_49c;
  ulong local_498;
  ulong local_490;
  ulong local_488;
  ulong local_480;
  ulong local_478;
  ulong local_470;
  ulong local_468;
  ulong local_460;
  ulong local_458;
  ulong local_450;
  ulong local_448;
  long local_440;
  undefined1 local_438 [200];
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined1 local_338 [200];
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined8 local_240;
  undefined1 local_238 [200];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined8 local_140;
  undefined1 local_138 [264];
  
  __src = (state->block_state).snd;
  puVar13 = state->buf;
  uVar11 = state->total_len;
  local_4c0 = output;
  uVar6 = block_len(a);
  uVar7 = block_len(a);
  uVar9 = (ulong)uVar7;
  if ((uVar11 == 0) || (uVar11 % (ulong)uVar6 != 0)) {
    uVar9 = uVar11 % uVar9;
  }
  memset(&local_588,0,200);
  memcpy(&local_588,__src,200);
  uVar19 = (uint)a;
  uVar6 = block_len(a);
  uVar5 = (ushort)uVar9 & 0xff;
  uVar7 = block_len(a);
  uVar11 = (ulong)uVar7;
  if (((uint32_t)uVar9 == 0) || ((char)(uVar5 % (ushort)(byte)uVar6) != '\0')) {
    uVar11 = (ulong)(byte)(uVar5 % (ushort)(byte)uVar7);
  }
  block_len(a);
  Hacl_Hash_SHA3_update_multi_sha3(a,&local_588,puVar13,0);
  Hacl_Hash_SHA3_update_last_sha3(a,&local_588,puVar13 + (uVar9 - uVar11),(uint32_t)uVar9);
  if ((a & 0xfe) == 0xc) {
    uVar6 = block_len(a);
    if (uVar6 <= l) {
      uVar11 = 0;
      local_49c = (uint)a;
      do {
        local_350 = 0;
        uStack_348 = 0;
        local_360 = 0;
        uStack_358 = 0;
        local_370 = 0;
        uStack_368 = 0;
        local_340 = 0;
        memcpy(local_438,&local_588,200);
        memcpy(local_138,local_438,0x100);
        uVar6 = block_len((Spec_Hash_Definitions_hash_alg)uVar19);
        puVar13 = local_4c0 + uVar6 * (int)uVar11;
        local_488 = uVar11;
        uVar6 = block_len((Spec_Hash_Definitions_hash_alg)uVar19);
        memcpy(puVar13,local_138,(ulong)uVar6);
        local_498 = local_538;
        local_490 = local_528;
        auVar23._8_8_ = uStack_548;
        auVar23._0_8_ = local_550;
        auVar27._8_8_ = uStack_558;
        auVar27._0_8_ = local_560;
        local_4b0 = local_520;
        local_4b8 = local_4f8;
        local_4a8 = local_518;
        lVar8 = 0;
        uVar9 = local_4e0;
        uVar12 = local_4e8;
        uVar15 = local_588;
        uVar10 = local_508;
        uVar18 = local_530;
        uVar16 = local_510;
        uVar20 = local_500;
        uVar21 = local_4d8;
        do {
          local_468 = local_540;
          local_440 = lVar8;
          local_458 = auVar27._8_8_;
          local_450 = uVar18;
          uVar11 = local_458 ^ uVar18 ^ uVar10 ^ CONCAT44(uStack_57c,uStack_580) ^ uVar9;
          local_448 = auVar23._8_8_;
          local_460 = local_570._0_8_;
          local_470 = local_448 ^ local_4b0 ^ local_4b8 ^ local_570._0_8_ ^ local_4d0;
          uVar17 = (local_470 << 1 | (ulong)((long)local_470 < 0)) ^ uVar11;
          local_478 = local_570._8_8_;
          uVar14 = local_540 ^ local_4a8 ^ local_4f0 ^ local_4c8 ^ local_570._8_8_;
          uVar11 = (uVar11 << 1 | (ulong)((long)uVar11 < 0)) ^ uVar14;
          local_480 = uStack_578;
          local_588 = uVar15 ^ uVar11;
          local_560 = auVar27._0_8_ ^ uVar11;
          local_538 = local_498 ^ uVar11;
          local_510 = uVar16 ^ uVar11;
          uVar16 = uVar15 ^ local_498 ^ uVar16 ^ auVar27._0_8_ ^ uVar12;
          local_4e8 = uVar11 ^ uVar12;
          uVar11 = auVar23._0_8_ ^ local_490 ^ uVar20 ^ uVar21 ^ uStack_578;
          uVar15 = (uVar14 << 1 | (ulong)((long)uVar14 < 0)) ^ uVar11;
          uVar12 = (uVar11 << 1 | (ulong)((long)uVar11 < 0)) ^ uVar16;
          uVar11 = CONCAT44(uStack_57c,uStack_580) ^ uVar12;
          uStack_580 = (uint)uVar11;
          uStack_57c = (uint)(uVar11 >> 0x20);
          uStack_558 = local_458 ^ uVar12;
          local_530 = uVar18 ^ uVar12;
          local_508 = uVar10 ^ uVar12;
          local_4e0 = uVar12 ^ uVar9;
          uStack_578 = uStack_578 ^ uVar17;
          local_550 = auVar23._0_8_ ^ uVar17;
          local_528 = local_490 ^ uVar17;
          local_500 = uVar20 ^ uVar17;
          local_4d8 = uVar17 ^ uVar21;
          uStack_548 = local_448 ^ uVar15;
          local_520 = local_4b0 ^ uVar15;
          local_4f8 = local_4b8 ^ uVar15;
          local_4d0 = uVar15 ^ local_4d0;
          uVar9 = (uVar16 << 1 | (ulong)((long)uVar16 < 0)) ^ local_470;
          local_570._8_8_ = local_570._8_8_ ^ uVar9;
          local_570._0_8_ = local_570._0_8_ ^ uVar15;
          local_540 = local_540 ^ uVar9;
          local_518 = local_4a8 ^ uVar9;
          local_4f0 = local_4f0 ^ uVar9;
          local_4c8 = uVar9 ^ local_4c8;
          lVar8 = 0;
          do {
            uVar9 = (&local_588)[Hacl_Hash_SHA3_keccak_piln[lVar8]];
            bVar1 = (byte)Hacl_Hash_SHA3_keccak_rotc[lVar8] & 0x3f;
            (&local_588)[Hacl_Hash_SHA3_keccak_piln[lVar8]] =
                 uVar11 << bVar1 | uVar11 >> 0x40 - bVar1;
            uVar19 = local_49c;
            lVar8 = lVar8 + 1;
            uVar11 = uVar9;
          } while (lVar8 != 0x18);
          uVar22 = local_570._0_4_;
          uVar24 = local_570._4_4_;
          uVar25 = local_570._8_4_;
          uVar26 = local_570._12_4_;
          uVar11 = ~CONCAT44(uStack_57c,uStack_580) & uStack_578;
          auVar28._0_8_ = local_570._8_8_;
          auVar28._8_8_ = local_588;
          auVar3._8_4_ = uStack_580;
          auVar3._0_8_ = local_588;
          auVar3._12_4_ = uStack_57c;
          local_570 = ~auVar28 & auVar3 ^ local_570;
          uStack_580 = ~(uint)uStack_578 & uVar22 ^ uStack_580;
          uStack_57c = ~uStack_578._4_4_ & uVar24 ^ uStack_57c;
          uStack_578 = CONCAT44(~uVar24 & uVar26 ^ uStack_578._4_4_,
                                ~uVar22 & uVar25 ^ (uint)uStack_578);
          auVar4._8_8_ = local_540;
          auVar4._0_8_ = uStack_548;
          uVar22 = (uint)(uStack_548 >> 0x20);
          uVar24 = (uint)(uStack_558 >> 0x20);
          uVar25 = (uint)(local_550 >> 0x20);
          auVar29._8_8_ = local_560;
          auVar29._0_8_ = local_540;
          auVar27._0_8_ =
               CONCAT44(~uVar24 & uVar25 ^ (uint)(local_560 >> 0x20),
                        ~(uint)uStack_558 & (uint)local_550 ^ (uint)local_560);
          auVar27._8_4_ = ~(uint)local_550 & (uint)uStack_548 ^ (uint)uStack_558;
          auVar27._12_4_ = ~uVar25 & uVar22 ^ uVar24;
          auVar2._8_4_ = (uint)uStack_548;
          auVar2._0_8_ = local_550;
          auVar2._12_4_ = uVar22;
          auVar23 = ~auVar4 & auVar29 ^ auVar2;
          local_540 = ~local_560 & uStack_558 ^ local_540;
          uStack_558 = auVar27._8_8_;
          local_550 = auVar23._0_8_;
          uStack_548 = auVar23._8_8_;
          local_498 = ~local_530 & local_528 ^ local_538;
          local_490 = ~local_520 & local_518 ^ local_528;
          uVar18 = ~local_528 & local_520 ^ local_530;
          local_520 = ~local_518 & local_538 ^ local_520;
          local_518 = ~local_538 & local_530 ^ local_518;
          local_4b0 = local_520;
          local_4a8 = local_518;
          uVar20 = ~local_4f8 & local_4f0 ^ local_500;
          uVar10 = ~local_500 & local_4f8;
          local_4f8 = ~local_4f0 & local_510 ^ local_4f8;
          uVar16 = ~local_508 & local_500 ^ local_510;
          uVar10 = uVar10 ^ local_508;
          local_4f0 = ~local_510 & local_508 ^ local_4f0;
          local_4b8 = local_4f8;
          uVar21 = ~local_4d0 & local_4c8 ^ local_4d8;
          uVar9 = ~local_4d8 & local_4d0;
          local_4d0 = ~local_4c8 & local_4e8 ^ local_4d0;
          uVar12 = ~local_4e0 & local_4d8 ^ local_4e8;
          uVar9 = uVar9 ^ local_4e0;
          local_4c8 = ~local_4e8 & local_4e0 ^ local_4c8;
          uVar15 = uVar11 ^ Hacl_Hash_SHA3_keccak_rndc[local_440] ^ local_588;
          lVar8 = local_440 + 1;
        } while (lVar8 != 0x18);
        uVar22 = (int)local_488 + 1;
        uVar11 = (ulong)uVar22;
        a = (Spec_Hash_Definitions_hash_alg)local_49c;
        local_588 = uVar15;
        local_560 = auVar27._0_8_;
        local_538 = local_498;
        local_530 = uVar18;
        local_528 = local_490;
        local_510 = uVar16;
        local_508 = uVar10;
        local_500 = uVar20;
        local_4e8 = uVar12;
        local_4e0 = uVar9;
        local_4d8 = uVar21;
        uVar6 = block_len(a);
      } while (uVar22 < l / uVar6);
    }
    uVar6 = block_len(a);
    __dest = local_238;
    local_170 = (undefined1  [16])0x0;
    local_160 = (undefined1  [16])0x0;
    local_150 = (undefined1  [16])0x0;
    local_140 = 0;
    memcpy(__dest,&local_588,200);
    uVar11 = (ulong)l % (ulong)uVar6;
    puVar13 = local_4c0 + (l - uVar11);
  }
  else {
    hash_len(a);
    block_len(a);
    uVar6 = hash_len(a);
    block_len(a);
    __dest = local_338;
    local_270 = (undefined1  [16])0x0;
    local_260 = (undefined1  [16])0x0;
    local_250 = (undefined1  [16])0x0;
    local_240 = 0;
    memcpy(__dest,&local_588,200);
    uVar7 = hash_len(a);
    uVar11 = (ulong)uVar6;
    puVar13 = local_4c0 + (uVar7 - uVar11);
  }
  memcpy(puVar13,__dest,uVar11);
  return;
}

Assistant:

static void
digest_(
  Spec_Hash_Definitions_hash_alg a,
  Hacl_Hash_SHA3_state_t *state,
  uint8_t *output,
  uint32_t l
)
{
  Hacl_Hash_SHA3_state_t scrut0 = *state;
  Hacl_Hash_SHA3_hash_buf block_state = scrut0.block_state;
  uint8_t *buf_ = scrut0.buf;
  uint64_t total_len = scrut0.total_len;
  uint32_t r;
  if (total_len % (uint64_t)block_len(a) == 0ULL && total_len > 0ULL)
  {
    r = block_len(a);
  }
  else
  {
    r = (uint32_t)(total_len % (uint64_t)block_len(a));
  }
  uint8_t *buf_1 = buf_;
  uint64_t buf[25U] = { 0U };
  Hacl_Hash_SHA3_hash_buf tmp_block_state = { .fst = a, .snd = buf };
  hash_buf2 scrut = { .fst = block_state, .snd = tmp_block_state };
  uint64_t *s_dst = scrut.snd.snd;
  uint64_t *s_src = scrut.fst.snd;
  memcpy(s_dst, s_src, 25U * sizeof (uint64_t));
  uint32_t ite;
  if (r % block_len(a) == 0U && r > 0U)
  {
    ite = block_len(a);
  }
  else
  {
    ite = r % block_len(a);
  }
  uint8_t *buf_last = buf_1 + r - ite;
  uint8_t *buf_multi = buf_1;
  Spec_Hash_Definitions_hash_alg a1 = tmp_block_state.fst;
  uint64_t *s0 = tmp_block_state.snd;
  Hacl_Hash_SHA3_update_multi_sha3(a1, s0, buf_multi, 0U / block_len(a1));
  Spec_Hash_Definitions_hash_alg a10 = tmp_block_state.fst;
  uint64_t *s1 = tmp_block_state.snd;
  Hacl_Hash_SHA3_update_last_sha3(a10, s1, buf_last, r);
  Spec_Hash_Definitions_hash_alg a11 = tmp_block_state.fst;
  uint64_t *s = tmp_block_state.snd;
  if (a11 == Spec_Hash_Definitions_Shake128 || a11 == Spec_Hash_Definitions_Shake256)
  {
    for (uint32_t i0 = 0U; i0 < l / block_len(a11); i0++)
    {
      uint8_t hbuf[256U] = { 0U };
      uint64_t ws[32U] = { 0U };
      memcpy(ws, s, 25U * sizeof (uint64_t));
      for (uint32_t i = 0U; i < 32U; i++)
      {
        store64_le(hbuf + i * 8U, ws[i]);
      }
      uint8_t *b0 = output;
      uint8_t *uu____0 = hbuf;
      memcpy(b0 + i0 * block_len(a11), uu____0, block_len(a11) * sizeof (uint8_t));
      for (uint32_t i1 = 0U; i1 < 24U; i1++)
      {
        uint64_t _C[5U] = { 0U };
        KRML_MAYBE_FOR5(i,
          0U,
          5U,
          1U,
          _C[i] = s[i + 0U] ^ (s[i + 5U] ^ (s[i + 10U] ^ (s[i + 15U] ^ s[i + 20U]))););
        KRML_MAYBE_FOR5(i2,
          0U,
          5U,
          1U,
          uint64_t uu____1 = _C[(i2 + 1U) % 5U];
          uint64_t _D = _C[(i2 + 4U) % 5U] ^ (uu____1 << 1U | uu____1 >> 63U);
          KRML_MAYBE_FOR5(i, 0U, 5U, 1U, s[i2 + 5U * i] = s[i2 + 5U * i] ^ _D;););
        uint64_t x = s[1U];
        uint64_t current = x;
        for (uint32_t i = 0U; i < 24U; i++)
        {
          uint32_t _Y = Hacl_Hash_SHA3_keccak_piln[i];
          uint32_t r1 = Hacl_Hash_SHA3_keccak_rotc[i];
          uint64_t temp = s[_Y];
          uint64_t uu____2 = current;
          s[_Y] = uu____2 << r1 | uu____2 >> (64U - r1);
          current = temp;
        }
        KRML_MAYBE_FOR5(i,
          0U,
          5U,
          1U,
          uint64_t v0 = s[0U + 5U * i] ^ (~s[1U + 5U * i] & s[2U + 5U * i]);
          uint64_t v1 = s[1U + 5U * i] ^ (~s[2U + 5U * i] & s[3U + 5U * i]);
          uint64_t v2 = s[2U + 5U * i] ^ (~s[3U + 5U * i] & s[4U + 5U * i]);
          uint64_t v3 = s[3U + 5U * i] ^ (~s[4U + 5U * i] & s[0U + 5U * i]);
          uint64_t v4 = s[4U + 5U * i] ^ (~s[0U + 5U * i] & s[1U + 5U * i]);
          s[0U + 5U * i] = v0;
          s[1U + 5U * i] = v1;
          s[2U + 5U * i] = v2;
          s[3U + 5U * i] = v3;
          s[4U + 5U * i] = v4;);
        uint64_t c = Hacl_Hash_SHA3_keccak_rndc[i1];
        s[0U] = s[0U] ^ c;
      }
    }
    uint32_t remOut = l % block_len(a11);
    uint8_t hbuf[256U] = { 0U };
    uint64_t ws[32U] = { 0U };
    memcpy(ws, s, 25U * sizeof (uint64_t));
    for (uint32_t i = 0U; i < 32U; i++)
    {
      store64_le(hbuf + i * 8U, ws[i]);
    }
    memcpy(output + l - remOut, hbuf, remOut * sizeof (uint8_t));
    return;
  }
  for (uint32_t i0 = 0U; i0 < hash_len(a11) / block_len(a11); i0++)
  {
    uint8_t hbuf[256U] = { 0U };
    uint64_t ws[32U] = { 0U };
    memcpy(ws, s, 25U * sizeof (uint64_t));
    for (uint32_t i = 0U; i < 32U; i++)
    {
      store64_le(hbuf + i * 8U, ws[i]);
    }
    uint8_t *b0 = output;
    uint8_t *uu____3 = hbuf;
    memcpy(b0 + i0 * block_len(a11), uu____3, block_len(a11) * sizeof (uint8_t));
    for (uint32_t i1 = 0U; i1 < 24U; i1++)
    {
      uint64_t _C[5U] = { 0U };
      KRML_MAYBE_FOR5(i,
        0U,
        5U,
        1U,
        _C[i] = s[i + 0U] ^ (s[i + 5U] ^ (s[i + 10U] ^ (s[i + 15U] ^ s[i + 20U]))););
      KRML_MAYBE_FOR5(i2,
        0U,
        5U,
        1U,
        uint64_t uu____4 = _C[(i2 + 1U) % 5U];
        uint64_t _D = _C[(i2 + 4U) % 5U] ^ (uu____4 << 1U | uu____4 >> 63U);
        KRML_MAYBE_FOR5(i, 0U, 5U, 1U, s[i2 + 5U * i] = s[i2 + 5U * i] ^ _D;););
      uint64_t x = s[1U];
      uint64_t current = x;
      for (uint32_t i = 0U; i < 24U; i++)
      {
        uint32_t _Y = Hacl_Hash_SHA3_keccak_piln[i];
        uint32_t r1 = Hacl_Hash_SHA3_keccak_rotc[i];
        uint64_t temp = s[_Y];
        uint64_t uu____5 = current;
        s[_Y] = uu____5 << r1 | uu____5 >> (64U - r1);
        current = temp;
      }
      KRML_MAYBE_FOR5(i,
        0U,
        5U,
        1U,
        uint64_t v0 = s[0U + 5U * i] ^ (~s[1U + 5U * i] & s[2U + 5U * i]);
        uint64_t v1 = s[1U + 5U * i] ^ (~s[2U + 5U * i] & s[3U + 5U * i]);
        uint64_t v2 = s[2U + 5U * i] ^ (~s[3U + 5U * i] & s[4U + 5U * i]);
        uint64_t v3 = s[3U + 5U * i] ^ (~s[4U + 5U * i] & s[0U + 5U * i]);
        uint64_t v4 = s[4U + 5U * i] ^ (~s[0U + 5U * i] & s[1U + 5U * i]);
        s[0U + 5U * i] = v0;
        s[1U + 5U * i] = v1;
        s[2U + 5U * i] = v2;
        s[3U + 5U * i] = v3;
        s[4U + 5U * i] = v4;);
      uint64_t c = Hacl_Hash_SHA3_keccak_rndc[i1];
      s[0U] = s[0U] ^ c;
    }
  }
  uint32_t remOut = hash_len(a11) % block_len(a11);
  uint8_t hbuf[256U] = { 0U };
  uint64_t ws[32U] = { 0U };
  memcpy(ws, s, 25U * sizeof (uint64_t));
  for (uint32_t i = 0U; i < 32U; i++)
  {
    store64_le(hbuf + i * 8U, ws[i]);
  }
  uint8_t *uu____6 = hbuf;
  memcpy(output + hash_len(a11) - remOut, uu____6, remOut * sizeof (uint8_t));
}